

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

CURLcode cf_happy_eyeballs_create
                   (Curl_cfilter **pcf,Curl_easy *data,connectdata *conn,
                   cf_ip_connect_create *cf_create,Curl_dns_entry *remotehost,int transport)

{
  int *ctx_00;
  CURLcode local_44;
  CURLcode result;
  cf_he_ctx *ctx;
  int transport_local;
  Curl_dns_entry *remotehost_local;
  cf_ip_connect_create *cf_create_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  Curl_cfilter **pcf_local;
  
  *pcf = (Curl_cfilter *)0x0;
  ctx_00 = (int *)(*Curl_ccalloc)(1,0x48);
  if (ctx_00 == (int *)0x0) {
    local_44 = CURLE_OUT_OF_MEMORY;
  }
  else {
    *ctx_00 = transport;
    *(cf_ip_connect_create **)(ctx_00 + 2) = cf_create;
    *(Curl_dns_entry **)(ctx_00 + 4) = remotehost;
    local_44 = Curl_cf_create(pcf,&Curl_cft_happy_eyeballs,ctx_00);
  }
  if (local_44 != CURLE_OK) {
    (*Curl_cfree)(*pcf);
    *pcf = (Curl_cfilter *)0x0;
    (*Curl_cfree)(ctx_00);
  }
  return local_44;
}

Assistant:

static CURLcode
cf_happy_eyeballs_create(struct Curl_cfilter **pcf,
                         struct Curl_easy *data,
                         struct connectdata *conn,
                         cf_ip_connect_create *cf_create,
                         const struct Curl_dns_entry *remotehost,
                         int transport)
{
  struct cf_he_ctx *ctx = NULL;
  CURLcode result;

  (void)data;
  (void)conn;
  *pcf = NULL;
  ctx = calloc(1, sizeof(*ctx));
  if(!ctx) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }
  ctx->transport = transport;
  ctx->cf_create = cf_create;
  ctx->remotehost = remotehost;

  result = Curl_cf_create(pcf, &Curl_cft_happy_eyeballs, ctx);

out:
  if(result) {
    Curl_safefree(*pcf);
    Curl_safefree(ctx);
  }
  return result;
}